

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O1

EStatusCode __thiscall Type1Input::ParseEncoding(Type1Input *this)

{
  InputPFBDecodeStream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inReadFrom;
  int iVar1;
  EStatusCode EVar2;
  ulong uVar3;
  uint uVar4;
  STDStreamsReader<int> reader;
  BoolAndString token_1;
  BoolAndString token;
  STDStreamsReader<int> local_89;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  BoolAndString local_60;
  Type1Input *local_38;
  
  this_00 = &this->mPFBDecoder;
  InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_60,this_00);
  EVar2 = eFailure;
  if (local_60.first == true) {
    inReadFrom = &local_60.second;
    iVar1 = std::__cxx11::string::compare((char *)inReadFrom);
    if (iVar1 == 0) {
      (this->mEncoding).EncodingType = eType1EncodingTypeStandardEncoding;
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_88,this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
      }
      EVar2 = -(local_88._0_4_ & 0xff ^ 1);
    }
    else {
      (this->mEncoding).EncodingType = eType1EncodingTypeCustom;
      local_38 = this;
      do {
        if (local_60.first != true) break;
        InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_88,this_00);
        local_60.first = local_88[0];
        std::__cxx11::string::operator=((string *)inReadFrom,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        }
        iVar1 = std::__cxx11::string::compare((char *)inReadFrom);
      } while (iVar1 != 0);
      if (local_60.first == true) {
        uVar4 = 0xffffffff;
        local_38 = (Type1Input *)(local_38->mEncoding).mCustomEncoding;
        do {
          iVar1 = std::__cxx11::string::compare((char *)inReadFrom);
          if ((iVar1 == 0) ||
             (iVar1 = std::__cxx11::string::compare((char *)inReadFrom), iVar1 == 0)) break;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_88,this_00);
          local_60.first = local_88[0];
          std::__cxx11::string::operator=((string *)inReadFrom,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_p != &local_70) {
            operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
          }
          if (local_60.first == false) break;
          STDStreamsReader<int>::Read(&local_89,inReadFrom,(int *)local_88);
          uVar3 = (ulong)(uint)local_88._0_4_;
          if (0xff < uVar3) {
            uVar4 = 0;
            break;
          }
          InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_88,this_00);
          local_60.first = local_88[0];
          std::__cxx11::string::operator=((string *)inReadFrom,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_p != &local_70) {
            operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
          }
          if (local_60.first == false) break;
          std::__cxx11::string::substr((ulong)local_88,(ulong)inReadFrom);
          std::__cxx11::string::operator=
                    ((string *)((local_38->mFontDictionary).FontMatrix + uVar3 * 4 + -6),
                     (string *)local_88);
          if ((size_type *)CONCAT44(local_88._4_4_,local_88._0_4_) != &local_78) {
            operator_delete((size_type *)CONCAT44(local_88._4_4_,local_88._0_4_),local_78 + 1);
          }
          InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_88,this_00);
          local_60.first = local_88[0];
          std::__cxx11::string::operator=((string *)inReadFrom,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_p != &local_70) {
            operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
          }
          if (local_60.first == false) break;
          InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_88,this_00);
          local_60.first = local_88[0];
          std::__cxx11::string::operator=((string *)inReadFrom,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_p != &local_70) {
            operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
          }
        } while (local_60.first != false);
        EVar2 = (local_60.first & uVar4) + eFailure;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != &local_60.second.field_2) {
    operator_delete(local_60.second._M_dataplus._M_p,
                    local_60.second.field_2._M_allocated_capacity + 1);
  }
  return EVar2;
}

Assistant:

EStatusCode Type1Input::ParseEncoding()
{
	BoolAndString token = mPFBDecoder.GetNextToken();
	EStatusCode status = eSuccess;
	int encodingIndex = 0;

	if(!token.first)
		return eFailure;

	// checking for standard encoding
	if(token.second.compare("StandardEncoding") == 0)
	{
		mEncoding.EncodingType = eType1EncodingTypeStandardEncoding;

		// skip the def
		BoolAndString token = mPFBDecoder.GetNextToken();
		if(!token.first)
			return eFailure;
		return eSuccess;
	}

	// not standard encoding, parse custom encoding
	mEncoding.EncodingType = eType1EncodingTypeCustom;

	// hop hop...skip to the first dup
	while(token.first)
	{
		token = mPFBDecoder.GetNextToken();
		if(token.second.compare("dup") == 0)
			break;
	}
	if(!token.first)
		return eFailure;

	// k. now parse the repeats of "dup index charactername put"
	// till the first occurence of "readonly" or "def".
	while(token.first)
	{
		if(token.second.compare("readonly") == 0 || token.second.compare("def") == 0)
			break;

		// get the index from the next token
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;
		encodingIndex = Int(token.second);
		if(encodingIndex < 0 || encodingIndex > 255)
		{
			status = eFailure;
			break;
		}
		
		// get the glyph name
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;
		mEncoding.mCustomEncoding[encodingIndex] = FromPSName(token.second);

		// skip the put
		token = mPFBDecoder.GetNextToken();
		if(!token.first)
			break;

		// get next row first token [dup or end]
		token = mPFBDecoder.GetNextToken();
	}
	if(!token.first || status != eSuccess)
		return eFailure;

	return status;
}